

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O1

Fl_Widget * __thiscall Fl_Tabs::which(Fl_Tabs *this,int event_x,int event_y)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  Fl_Widget **ppFVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((this->super_Fl_Group).children_ != 0) {
    iVar3 = tab_height(this);
    iVar5 = (this->super_Fl_Group).super_Fl_Widget.y_;
    if (iVar3 < 0) {
      iVar5 = iVar5 + (this->super_Fl_Group).super_Fl_Widget.h_;
      if (iVar5 + iVar3 <= event_y && event_y <= iVar5) goto LAB_001cda03;
    }
    else if (iVar5 <= event_y && event_y <= iVar3 + iVar5) {
LAB_001cda03:
      if (event_x < (this->super_Fl_Group).super_Fl_Widget.x_) {
        return (Fl_Widget *)0x0;
      }
      uVar1 = (this->super_Fl_Group).children_;
      tab_positions(this);
      uVar7 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar7 = 0;
      }
      uVar2 = 0;
      do {
        uVar6 = uVar2;
        if (uVar7 == uVar6) {
          return (Fl_Widget *)0x0;
        }
        uVar2 = uVar6 + 1;
      } while (this->tab_pos[uVar6 + 1] + (this->super_Fl_Group).super_Fl_Widget.x_ <= event_x);
      ppFVar4 = Fl_Group::array(&this->super_Fl_Group);
      return ppFVar4[uVar6];
    }
  }
  return (Fl_Widget *)0x0;
}

Assistant:

Fl_Widget *Fl_Tabs::which(int event_x, int event_y) {
  if (children() == 0) return 0;
  int H = tab_height();
  if (H < 0) {
    if (event_y > y()+h() || event_y < y()+h()+H) return 0;
  } else {
    if (event_y > y()+H || event_y < y()) return 0;
  }
  if (event_x < x()) return 0;
  Fl_Widget *ret = 0L;
  const int nc = children();
  tab_positions();
  for (int i=0; i<nc; i++) {
    if (event_x < x()+tab_pos[i+1]) {
      ret = child(i);
      break;
    }
  }
  return ret;
}